

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getImmediateSubTypes(SubTypes *this,HeapType type)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
  local_28;
  const_iterator iter;
  SubTypes *this_local;
  HeapType type_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
               )this;
  this_local = (SubTypes *)type.id;
  if (getImmediateSubTypes(wasm::HeapType)::empty == '\0') {
    iVar2 = __cxa_guard_acquire(&getImmediateSubTypes(wasm::HeapType)::empty);
    if (iVar2 != 0) {
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                (&getImmediateSubTypes::empty);
      __cxa_atexit(std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector,
                   &getImmediateSubTypes::empty,&__dso_handle);
      __cxa_guard_release(&getImmediateSubTypes(wasm::HeapType)::empty);
    }
  }
  bVar1 = HeapType::isBottom((HeapType *)&this_local);
  if (bVar1) {
    type_local.id = (uintptr_t)&getImmediateSubTypes::empty;
  }
  else {
    bVar1 = HeapType::isBasic((HeapType *)&this_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!type.isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/subtypes.h"
                    ,0x31,
                    "const std::vector<HeapType> &wasm::SubTypes::getImmediateSubTypes(HeapType) const"
                   );
    }
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
         ::find(&this->typeSubTypes,(key_type *)&this_local);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
         ::end(&this->typeSubTypes);
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (bVar1) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_false,_true>
                             *)&local_28);
      type_local.id = (uintptr_t)&pvVar3->second;
    }
    else {
      type_local.id = (uintptr_t)&getImmediateSubTypes::empty;
    }
  }
  return (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)type_local.id;
}

Assistant:

const std::vector<HeapType>& getImmediateSubTypes(HeapType type) const {
    // When we return an empty result, use a canonical constant empty vec to
    // avoid allocation.
    static const std::vector<HeapType> empty;

    if (type.isBottom()) {
      // Bottom types have no subtypes.
      return empty;
    }

    assert(!type.isBasic());
    if (auto iter = typeSubTypes.find(type); iter != typeSubTypes.end()) {
      return iter->second;
    }

    // No entry exists.
    return empty;
  }